

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

void __thiscall Quest_Context::BeginState(Quest_Context *this,string *name,State *state)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  reference pAVar5;
  const_reference pvVar6;
  Dialog *this_00;
  pointer ppVar7;
  element_type *peVar8;
  __enable_if_t<is_constructible<value_type,_pair<short,_shared_ptr<Dialog>_>_>::value,_pair<iterator,_bool>_>
  _Var9;
  string local_2d8;
  string local_2b8;
  _Base_ptr local_298;
  undefined1 local_290;
  shared_ptr<Dialog> local_288;
  pair<short,_std::shared_ptr<Dialog>_> local_278;
  _Base_ptr local_260;
  undefined1 local_258;
  _Self local_250;
  _Self local_248;
  iterator it_1;
  short vendor_id;
  undefined1 local_230 [8];
  string function_name;
  Action action;
  const_iterator __end1;
  const_iterator __begin1;
  deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *__range1;
  _Self local_30;
  _Self local_28;
  iterator it;
  State *state_local;
  string *name_local;
  Quest_Context *this_local;
  
  it._M_node = (_Base_ptr)state;
  std::__cxx11::string::operator=((string *)&this->state_desc,(string *)&state->desc);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
       ::begin(&this->progress);
  do {
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
           ::end(&this->progress);
      bVar2 = std::operator!=(&local_28,&local_30);
      if (!bVar2) {
        std::
        map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
        ::clear(&this->dialogs);
        bVar2 = Quest::Disabled(this->quest);
        if (!bVar2) {
          p_Var1 = it._M_node + 4;
          std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::begin
                    ((const_iterator *)&__end1._M_node,
                     (deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)&p_Var1->_M_right);
          std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::end
                    ((const_iterator *)
                     ((long)&action.expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data._M_finish + 0x18),
                     (deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)&p_Var1->_M_right);
          while (bVar2 = std::operator!=((_Self *)&__end1._M_node,
                                         (_Self *)((long)&action.expr.args.
                                                                                                                    
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish + 0x18))
                , bVar2) {
            pAVar5 = std::
                     _Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>
                     ::operator*((_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>
                                  *)&__end1._M_node);
            EOPlus::Action::Action((Action *)((long)&function_name.field_2 + 8),pAVar5);
            std::__cxx11::string::string
                      ((string *)local_230,
                       (string *)
                       ((long)&action.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 0x18));
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_230,"addnpctext");
            if ((bVar2) ||
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_230,"addnpcinput"), bVar2)) {
              pvVar6 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                 ((deque<util::variant,_std::allocator<util::variant>_> *)
                                  ((long)&action.expr.function.field_2 + 8),0);
              iVar3 = util::variant::operator_cast_to_int(pvVar6);
              it_1._M_node._2_2_ = (undefined2)iVar3;
              local_248._M_node =
                   (_Base_ptr)
                   std::
                   map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
                   ::find(&this->dialogs,(key_type *)((long)&it_1._M_node + 2));
              local_250._M_node =
                   (_Base_ptr)
                   std::
                   map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
                   ::end(&this->dialogs);
              bVar2 = std::operator==(&local_248,&local_250);
              if (bVar2) {
                this_00 = (Dialog *)operator_new(0x80);
                Dialog::Dialog(this_00);
                std::shared_ptr<Dialog>::shared_ptr<Dialog,void>(&local_288,this_00);
                std::make_pair<short&,std::shared_ptr<Dialog>>
                          (&local_278,(short *)((long)&it_1._M_node + 2),&local_288);
                _Var9 = std::
                        map<short,std::shared_ptr<Dialog>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
                        ::insert<std::pair<short,std::shared_ptr<Dialog>>>
                                  ((map<short,std::shared_ptr<Dialog>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
                                    *)&this->dialogs,&local_278);
                local_298 = (_Base_ptr)_Var9.first._M_node;
                local_290 = _Var9.second;
                local_260 = local_298;
                local_258 = local_290;
                local_248._M_node = local_298;
                std::pair<short,_std::shared_ptr<Dialog>_>::~pair(&local_278);
                std::shared_ptr<Dialog>::~shared_ptr(&local_288);
              }
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_230,"addnpctext");
              if (bVar2) {
                ppVar7 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>::
                         operator->(&local_248);
                peVar8 = std::__shared_ptr_access<Dialog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<Dialog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&ppVar7->second);
                pvVar6 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                   ((deque<util::variant,_std::allocator<util::variant>_> *)
                                    ((long)&action.expr.function.field_2 + 8),1);
                util::variant::operator_cast_to_string(&local_2b8,pvVar6);
                Dialog::AddPage(peVar8,&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_230,"addnpcinput");
                if (bVar2) {
                  ppVar7 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>
                           ::operator->(&local_248);
                  peVar8 = std::
                           __shared_ptr_access<Dialog,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                           operator->((__shared_ptr_access<Dialog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&ppVar7->second);
                  pvVar6 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                     ((deque<util::variant,_std::allocator<util::variant>_> *)
                                      ((long)&action.expr.function.field_2 + 8),1);
                  iVar3 = util::variant::operator_cast_to_int(pvVar6);
                  pvVar6 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                     ((deque<util::variant,_std::allocator<util::variant>_> *)
                                      ((long)&action.expr.function.field_2 + 8),2);
                  util::variant::operator_cast_to_string(&local_2d8,pvVar6);
                  Dialog::AddLink(peVar8,iVar3,&local_2d8);
                  std::__cxx11::string::~string((string *)&local_2d8);
                }
              }
            }
            std::__cxx11::string::~string((string *)local_230);
            EOPlus::Action::~Action((Action *)((long)&function_name.field_2 + 8));
            std::_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>::
            operator++((_Deque_iterator<EOPlus::Action,_const_EOPlus::Action_&,_const_EOPlus::Action_*>
                        *)&__end1._M_node);
          }
        }
        return;
      }
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
               ::operator->(&local_28);
      bVar2 = std::operator!=(&ppVar4->first,"d");
      if (bVar2) break;
LAB_00208d0d:
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
      ::operator++(&local_28);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
             ::operator->(&local_28);
    bVar2 = std::operator!=(&ppVar4->first,"c");
    if (!bVar2) goto LAB_00208d0d;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::string,short,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
         ::erase_abi_cxx11_((map<std::__cxx11::string,short,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                             *)&this->progress,local_28._M_node);
  } while( true );
}

Assistant:

void Quest_Context::BeginState(const std::string& name, const EOPlus::State& state)
{
	this->state_desc = state.desc;

	for (auto it = this->progress.begin(); it != this->progress.end(); )
	{
		if (it->first != "d" && it->first != "c")
			it = this->progress.erase(it);
		else
			++it;
	}

	this->dialogs.clear();

	if (this->quest->Disabled())
		return;

	UTIL_FOREACH(state.actions, action)
	{
		std::string function_name = action.expr.function;

		if (function_name == "addnpctext" || function_name == "addnpcinput")
		{
			short vendor_id = int(action.expr.args[0]);
			auto it = this->dialogs.find(vendor_id);

			if (it == this->dialogs.end())
				it = this->dialogs.insert(std::make_pair(vendor_id, std::shared_ptr<Dialog>(new Dialog()))).first;

			if (function_name == "addnpctext")
				it->second->AddPage(std::string(action.expr.args[1]));
			else if (function_name == "addnpcinput")
				it->second->AddLink(int(action.expr.args[1]), std::string(action.expr.args[2]));
		}
	}
}